

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O2

void Dch_ClassesCollectConst1Group(Dch_Cla_t *p,Aig_Obj_t *pObj,int nNodes,Vec_Ptr_t *vRoots)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Aig_Obj_t **ppAVar2;
  void *Entry;
  Aig_Obj_t *pAVar3;
  int iVar4;
  int i;
  
  vRoots->nSize = 0;
  i = pObj->Id;
  iVar1 = p->pAig->vObjs->nSize;
  iVar4 = nNodes + i;
  if (iVar1 <= nNodes + i) {
    iVar4 = iVar1;
  }
  for (; i < iVar4; i = i + 1) {
    p_00 = p->pAig->vObjs;
    if (p_00 != (Vec_Ptr_t *)0x0) {
      Entry = Vec_PtrEntry(p_00,i);
      if (Entry != (void *)0x0) {
        ppAVar2 = p->pAig->pReprs;
        if (ppAVar2 == (Aig_Obj_t **)0x0) {
          pAVar3 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar3 = ppAVar2[*(int *)((long)Entry + 0x24)];
        }
        if (pAVar3 == p->pAig->pConst1) {
          Vec_PtrPush(vRoots,Entry);
        }
      }
    }
  }
  return;
}

Assistant:

void Dch_ClassesCollectConst1Group( Dch_Cla_t * p, Aig_Obj_t * pObj, int nNodes, Vec_Ptr_t * vRoots )
{
    int i, Limit;
    Vec_PtrClear( vRoots );
    Limit = Abc_MinInt( pObj->Id + nNodes, Aig_ManObjNumMax(p->pAig) );
    for ( i = pObj->Id; i < Limit; i++ )
    {
        pObj = Aig_ManObj( p->pAig, i );
        if ( pObj && Dch_ObjIsConst1Cand( p->pAig, pObj ) )
            Vec_PtrPush( vRoots, pObj );
    }
}